

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

bool __thiscall
Js::SerializationCloner<Js::StreamWriter>::TryCloneObject
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src,Dst *dst,
          SCADeepCloneType *deepClone)

{
  StreamWriter *pSVar1;
  code *pcVar2;
  bool bVar3;
  RegexFlags RVar4;
  byte bVar5;
  BOOL BVar6;
  charcount_t cVar7;
  int iVar8;
  uint uVar9;
  uint32 uVar10;
  Engine *this_00;
  JavascriptDate *this_01;
  JavascriptBooleanObject *this_02;
  JavascriptNumberObject *this_03;
  JavascriptStringObject *this_04;
  char16 *pcVar11;
  undefined4 extraout_var;
  undefined4 *puVar12;
  byte *bytes;
  BYTE *bytes_00;
  SCATypeId typeId_00;
  SharedContents *local_e8;
  SharedContents *local_e0;
  SharedContents *sharedContents_1;
  WebAssemblySharedArrayBuffer *buf_2;
  ArrayBufferBase *buffer;
  WebAssemblyMemory *wasmMem;
  WebAssemblyModule *wasmModule;
  WebAssemblyModule *local_b0;
  SharedContents *sharedContents;
  SharedArrayBuffer *buf_1;
  ArrayBuffer *buf;
  JavascriptString *str_2;
  uint local_84;
  undefined1 local_80 [4];
  DWORD flags;
  InternalString str_1;
  JavascriptRegExp *regex;
  Type local_60;
  JavascriptString *str;
  Type local_50;
  size_t transferredIndex;
  RecyclableObject *pRStack_40;
  scaposition_t beginPos;
  RecyclableObject *obj;
  SCADeepCloneType *deepClone_local;
  Dst *dst_local;
  Src src_local;
  SerializationCloner<Js::StreamWriter> *pSStack_18;
  SrcTypeId typeId_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  obj = (RecyclableObject *)deepClone;
  deepClone_local = dst;
  dst_local = (Dst *)src;
  src_local._4_4_ = typeId;
  pSStack_18 = this;
  pRStack_40 = VarTo<Js::RecyclableObject>(src);
  transferredIndex._4_4_ = StreamWriter::GetPosition(this->m_writer);
  *(undefined4 *)
   &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
  local_50.ptr = (void *)0x0;
  bVar3 = CanBeTransferred(this,src_local._4_4_);
  if (bVar3) {
    this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
              ::GetEngine(&this->
                           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                         );
    bVar3 = SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::
            TryGetTransferredOrShared(this_00,dst_local,(size_t *)&local_50);
    if (bVar3) {
      WriteTypeId(this,SCA_Transferable);
      str._4_4_ = SUB84(local_50.ptr,0);
      StreamWriter::Write<unsigned_int>(this->m_writer,(uint *)((long)&str + 4));
      goto LAB_0160509f;
    }
  }
  bVar3 = Js::JavascriptOperators::IsObjectDetached(dst_local);
  if (bVar3) {
    ScriptContextHolder::ThrowSCAObjectDetached((ScriptContextHolder *)this);
  }
  switch(src_local._4_4_) {
  case TypeIds_String:
    local_60.ptr = (RegexPattern *)VarTo<Js::JavascriptString,Js::RecyclableObject>(pRStack_40);
    WriteTypeId(this,SCA_StringValue);
    pcVar11 = JavascriptString::GetString((JavascriptString *)local_60.ptr);
    cVar7 = JavascriptString::GetLength((JavascriptString *)local_60.ptr);
    Write(this,pcVar11,cVar7);
    break;
  case TypeIds_Proxy:
    return false;
  case TypeIds_Object:
    WriteTypeId(this,SCA_Object);
    *(undefined4 *)
     &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
    break;
  case TypeIds_Array:
  case TypeIds_NativeIntArray:
  case TypeIds_ArrayLast:
  case TypeIds_ArrayLastWithES5:
    *(undefined4 *)
     &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 1;
    break;
  case TypeIds_CopyOnAccessNativeIntArray:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                ,0xfd,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  default:
    bVar3 = IsTypedArray(src_local._4_4_);
    if (bVar3) {
      WriteTypedArray(this,src_local._4_4_,dst_local);
    }
    else {
      *(undefined4 *)
       &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 4
      ;
    }
    break;
  case TypeIds_Date:
    WriteTypeId(this,SCA_DateObject);
    pSVar1 = this->m_writer;
    this_01 = VarTo<Js::JavascriptDate>(dst_local);
    regex = (JavascriptRegExp *)JavascriptDate::GetTime(this_01);
    StreamWriter::Write<double>(pSVar1,(double *)&regex);
    break;
  case TypeIds_RegEx:
    str_1.m_content.ptr = (char16_t *)VarTo<Js::JavascriptRegExp>(dst_local);
    JavascriptRegExp::GetSource((JavascriptRegExp *)local_80);
    RVar4 = JavascriptRegExp::GetFlags((JavascriptRegExp *)str_1.m_content.ptr);
    local_84 = (uint)RVar4;
    WriteTypeId(this,SCA_RegExpObject);
    pcVar11 = InternalString::GetBuffer((InternalString *)local_80);
    cVar7 = InternalString::GetLength((InternalString *)local_80);
    Write(this,pcVar11,cVar7);
    StreamWriter::Write<unsigned_int>(this->m_writer,&local_84);
    break;
  case TypeIds_BooleanObject:
    this_02 = VarTo<Js::JavascriptBooleanObject>(dst_local);
    BVar6 = JavascriptBooleanObject::GetValue(this_02);
    typeId_00 = SCA_BooleanFalseObject;
    if (BVar6 != 0) {
      typeId_00 = SCA_BooleanTrueObject;
    }
    WriteTypeId(this,typeId_00);
    break;
  case TypeIds_NumberObject:
    WriteTypeId(this,SCA_NumberObject);
    pSVar1 = this->m_writer;
    this_03 = VarTo<Js::JavascriptNumberObject>(dst_local);
    str_2 = (JavascriptString *)JavascriptNumberObject::GetValue(this_03);
    StreamWriter::Write<double>(pSVar1,(double *)&str_2);
    break;
  case TypeIds_StringObject:
    this_04 = VarTo<Js::JavascriptStringObject>(dst_local);
    buf = (ArrayBuffer *)JavascriptStringObject::Unwrap(this_04);
    WriteTypeId(this,SCA_StringObject);
    pcVar11 = JavascriptString::GetString((JavascriptString *)buf);
    cVar7 = JavascriptString::GetLength((JavascriptString *)buf);
    Write(this,pcVar11,cVar7);
    break;
  case TypeIds_ArrayBuffer:
    buf_1 = (SharedArrayBuffer *)VarTo<Js::ArrayBuffer>(dst_local);
    WriteTypeId(this,SCA_ArrayBuffer);
    iVar8 = (*(buf_1->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])();
    uVar10 = (*(buf_1->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
               super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
               [0x71])();
    Write(this,(BYTE *)CONCAT44(extraout_var,iVar8),uVar10);
    break;
  case TypeIds_Map:
    WriteTypeId(this,SCA_Map);
    *(undefined4 *)
     &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 2;
    break;
  case TypeIds_Set:
    WriteTypeId(this,SCA_Set);
    *(undefined4 *)
     &(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 3;
    break;
  case TypeIds_SharedArrayBuffer:
    sharedContents = (SharedContents *)VarTo<Js::SharedArrayBuffer>(dst_local);
    local_b0 = (WebAssemblyModule *)
               SharedArrayBuffer::GetSharedContents((SharedArrayBuffer *)sharedContents);
    bVar5 = (**(code **)(sharedContents->buffer + 0x368))();
    bVar3 = SharedContents::IsWebAssembly((SharedContents *)local_b0);
    if ((bool)(bVar5 & 1) != bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                  ,0xc3,
                                  "(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly())"
                                  ,
                                  "buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly()"
                                 );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    SharedContents::AddRef((SharedContents *)local_b0);
    JsUtil::
    List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->m_sharedContentsrList,(SharedContents **)&local_b0);
    WriteTypeId(this,SCA_SharedArrayBuffer);
    wasmModule = local_b0;
    StreamWriter::Write<long>(this->m_writer,(long *)&wasmModule);
    break;
  case TypeIds_WebAssemblyModule:
    wasmMem = (WebAssemblyMemory *)VarTo<Js::WebAssemblyModule>(dst_local);
    WriteTypeId(this,SCA_WebAssemblyModule);
    bytes = WebAssemblyModule::GetBinaryBuffer((WebAssemblyModule *)wasmMem);
    uVar9 = WebAssemblyModule::GetBinaryBufferLength((WebAssemblyModule *)wasmMem);
    Write(this,bytes,uVar9);
    break;
  case TypeIds_WebAssemblyMemory:
    buffer = (ArrayBufferBase *)VarTo<Js::WebAssemblyMemory>(dst_local);
    buf_2 = (WebAssemblySharedArrayBuffer *)
            WebAssemblyMemory::GetBuffer((WebAssemblyMemory *)buffer);
    WriteTypeId(this,SCA_WebAssemblyMemory);
    uVar9 = WebAssemblyMemory::GetInitialLength((WebAssemblyMemory *)buffer);
    Write(this,uVar9);
    uVar9 = WebAssemblyMemory::GetMaximumLength((WebAssemblyMemory *)buffer);
    Write(this,uVar9);
    bVar3 = WebAssemblyMemory::IsSharedMemory((WebAssemblyMemory *)buffer);
    Write(this,(uint)bVar3);
    bVar3 = WebAssemblyMemory::IsSharedMemory((WebAssemblyMemory *)buffer);
    if (bVar3) {
      sharedContents_1 =
           (SharedContents *)
           VarTo<Js::WebAssemblySharedArrayBuffer,Js::ArrayBufferBase>((ArrayBufferBase *)buf_2);
      local_e0 = SharedArrayBuffer::GetSharedContents((SharedArrayBuffer *)sharedContents_1);
      SharedContents::AddRef(local_e0);
      JsUtil::
      List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(this->m_sharedContentsrList,&local_e0);
      local_e8 = local_e0;
      StreamWriter::Write<long>(this->m_writer,(long *)&local_e8);
    }
    else {
      bytes_00 = (BYTE *)(**(code **)((long)(buf_2->super_JavascriptSharedArrayBuffer).
                                            super_SharedArrayBuffer.super_ArrayBufferBase.
                                            super_DynamicObject.super_RecyclableObject.
                                            super_FinalizableObject.super_IRecyclerVisitedObject +
                                     0x390))();
      uVar10 = (**(code **)((long)(buf_2->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer
                                  .super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                                  super_FinalizableObject.super_IRecyclerVisitedObject + 0x388))();
      Write(this,bytes_00,uVar10);
    }
  }
LAB_0160509f:
  *deepClone_local = transferredIndex._4_4_;
  return true;
}

Assistant:

bool SerializationCloner<Writer>::TryCloneObject(SrcTypeId typeId, Src src, Dst* dst, SCADeepCloneType* deepClone)
    {
        RecyclableObject* obj = VarTo<RecyclableObject>(src);
        scaposition_t beginPos = m_writer->GetPosition();
        *deepClone = SCADeepCloneType::None;

        size_t transferredIndex = 0;
        if (this->CanBeTransferred(typeId) && this->GetEngine()->TryGetTransferredOrShared(src, &transferredIndex))
        {
            WriteTypeId(SCA_Transferable);
            m_writer->Write((uint32)transferredIndex);
        }
        else if (JavascriptOperators::IsObjectDetached(src))
        {
            //Object is detached, throw error
            this->ThrowSCAObjectDetached();
        }
        else
        {
            switch (typeId)
            {
            case TypeIds_String: // Clone string value as object type to resolve multiple references
                {
                    JavascriptString* str = VarTo<JavascriptString>(obj);
                    WriteTypeId(SCA_StringValue);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_Object:
                {
                    WriteTypeId(SCA_Object);
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Proxy:
                {
                // Currently SCA algorithm does not support proxy. We'll see 
                // if the spec will be updated. I don't support QueryObjectInterface in proxy
                // so we don't want to go through the default code path.
                    return false;
                }
            case TypeIds_Array:
            case TypeIds_ES5Array:
            case TypeIds_NativeIntArray:
            case TypeIds_NativeFloatArray:
                {
                    // Postpone writing to CloneProperties
                    *deepClone = SCADeepCloneType::Object;
                }
                break;

            case TypeIds_Date:
                {
                    WriteTypeId(SCA_DateObject);
                    m_writer->Write(VarTo<JavascriptDate>(src)->GetTime());
                }
                break;

            case TypeIds_RegEx:
                {
                    JavascriptRegExp* regex = VarTo<JavascriptRegExp>(src);
                    InternalString str = regex->GetSource();
                    DWORD flags = static_cast<DWORD>(regex->GetFlags());
                    WriteTypeId(SCA_RegExpObject);
                    Write(str.GetBuffer(), str.GetLength());
                    m_writer->Write(flags);
                }
                break;

            case TypeIds_BooleanObject:
                WriteTypeId(VarTo<JavascriptBooleanObject>(src)->GetValue() ?
                    SCA_BooleanTrueObject : SCA_BooleanFalseObject);
                break;

            case TypeIds_NumberObject:
                {
                    WriteTypeId(SCA_NumberObject);
                    m_writer->Write(VarTo<JavascriptNumberObject>(src)->GetValue());
                }
                break;

            case TypeIds_StringObject:
                {
                    JavascriptString* str = VarTo<JavascriptStringObject>(src)->Unwrap();
                    WriteTypeId(SCA_StringObject);
                    Write(str->GetString(), str->GetLength());
                }
                break;

            case TypeIds_ArrayBuffer:
                {
                    ArrayBuffer* buf = VarTo<ArrayBuffer>(src);
                    WriteTypeId(SCA_ArrayBuffer);
                    Write(buf->GetBuffer(), buf->GetByteLength());
                }
                break;

            case TypeIds_SharedArrayBuffer:
                {
                    // TBD

                    //SCAContextType contextType;
                    //if (FAILED(this->m_pSCAContext->GetContext(&contextType)))
                    //{
                    //    return false;
                    //}
                    //
                    //if(contextType == SCAContext_CrossProcess || contextType == SCAContext_Persist)
                    //{
                    //    return false;
                    //}

                    SharedArrayBuffer* buf = VarTo<SharedArrayBuffer>(src);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    Assert(buf->IsWebAssemblyArrayBuffer() == sharedContents->IsWebAssembly());
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    WriteTypeId(SCA_SharedArrayBuffer);
                    m_writer->Write((intptr_t)sharedContents);
                }
                break;

            case TypeIds_Map:
                {
                    WriteTypeId(SCA_Map);
                    *deepClone = SCADeepCloneType::Map;
                }
                break;

            case TypeIds_Set:
                {
                    WriteTypeId(SCA_Set);
                    *deepClone = SCADeepCloneType::Set;
                }
                break;

#ifdef ENABLE_WASM
            case TypeIds_WebAssemblyModule:
                {
                    WebAssemblyModule* wasmModule = VarTo<WebAssemblyModule>(src);
                    WriteTypeId(SCA_WebAssemblyModule);
                    Write(wasmModule->GetBinaryBuffer(), wasmModule->GetBinaryBufferLength());
                }
                break;
            case TypeIds_WebAssemblyMemory:
            {
                WebAssemblyMemory* wasmMem = VarTo<WebAssemblyMemory>(src);
                ArrayBufferBase* buffer = wasmMem->GetBuffer();
                WriteTypeId(SCA_WebAssemblyMemory);
                Write(wasmMem->GetInitialLength());
                Write(wasmMem->GetMaximumLength());
#ifdef ENABLE_WASM_THREADS
                Write((uint32)wasmMem->IsSharedMemory());
                if (wasmMem->IsSharedMemory())
                {
                    WebAssemblySharedArrayBuffer* buf = VarTo<WebAssemblySharedArrayBuffer>(buffer);
                    SharedContents* sharedContents = buf->GetSharedContents();
                    sharedContents->AddRef();
                    this->m_sharedContentsrList->Add(sharedContents);
                    m_writer->Write((intptr_t)sharedContents);
                }
                else
#endif
                {
                    Write(buffer->GetBuffer(), buffer->GetByteLength());
                }
                break;
            }
#endif

#if ENABLE_COPYONACCESS_ARRAY
            case TypeIds_CopyOnAccessNativeIntArray:
                Assert(false);
                // fall-through
#endif

            default:
                if (IsTypedArray(typeId))
                {
                    WriteTypedArray(typeId, src);
                }
                else
                {
                    // Try Host Object
                    *deepClone = SCADeepCloneType::HostObject;
                }
                break;
            }
        }

        *dst = beginPos;
        return true;
    }